

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O3

void check_all_nodes_registered(EVmaster master)

{
  __time_t *p_Var1;
  undefined8 *puVar2;
  anon_union_16_6_9efb12f0_for_u *paVar3;
  uint uVar4;
  EVconfig_action_type EVar5;
  EVint_node_list p_Var6;
  _EVdfg_config_action *p_Var7;
  void *pvVar8;
  EVdfg_config_action act;
  EVdfg_config_action act_00;
  EVdfg_config_action act_01;
  EVdfg_config_action act_02;
  EVdfg_config_action act_03;
  EVdfg_config_action act_04;
  int iVar9;
  __pid_t _Var10;
  _EVdfg_config_action *p_Var11;
  EVdfg_configuration p_Var12;
  EVmaster p_Var13;
  EVdfg_configuration p_Var14;
  EVdfg_stone_state *pp_Var15;
  EVdfg_stone_state p_Var16;
  int *piVar17;
  char *pcVar18;
  char **ppcVar19;
  CMFormat format;
  pthread_t pVar20;
  int iVar21;
  EVstone EVar22;
  FILE *pFVar23;
  EVmaster p_Var24;
  EVdfg_stone_state extraout_RDX;
  ulong uVar25;
  long lVar26;
  long lVar27;
  FILE *out;
  CMConnection p_Var28;
  EVdfg_stone_state p_Var29;
  attr_list in_R8;
  EVdfg dfg;
  long lVar30;
  long lVar31;
  CManager p_Var32;
  byte bVar33;
  EVready_msg msg;
  timespec ts;
  undefined8 local_e8;
  undefined8 uStack_e0;
  anon_struct_8_2_24f754fc_for_period local_d8;
  char *pcStack_d0;
  EVmaster local_c0;
  undefined1 local_b8 [16];
  anon_union_40_5_866f0a8f_for_u local_a8;
  EVmaster local_78;
  undefined1 local_70 [24];
  _EVdfg_config_action *local_58;
  long local_50;
  CManager local_48;
  CMFormat local_40;
  long local_38;
  
  bVar33 = 0;
  if (master->node_join_handler == (EVmasterJoinHandlerFunc)0x0) {
    dfg = master->dfg;
    if (0 < (long)master->node_count) {
      lVar30 = 0;
      do {
        if ((*(int *)((long)&master->nodes->self + lVar30) == 0) &&
           (*(long *)((long)&master->nodes->conn + lVar30) == 0)) {
          return;
        }
        lVar30 = lVar30 + 0x38;
      } while ((long)master->node_count * 0x38 - lVar30 != 0);
    }
  }
  else {
    p_Var6 = master->nodes;
    iVar9 = master->node_count;
    IntCManager_unlock(master->cm,
                       "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                       ,0xb35);
    (*master->node_join_handler)(master,p_Var6[(long)iVar9 + -1].name,(void *)0x0,(void *)0x0);
    IntCManager_lock(master->cm,
                     "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                     ,0xb37);
    dfg = master->dfg;
    if (dfg == (EVdfg)0x0) {
      return;
    }
    if (dfg->realized == 0) {
      return;
    }
    if ((dfg->realized == 1) && (master->reconfig == 1)) {
      return;
    }
  }
  local_c0 = master;
  if (master->no_deployment != 0) goto LAB_001483a4;
  p_Var13 = dfg->master;
  if (p_Var13->sig_reconfig_bool == 0) {
    if (p_Var13->state != DFG_Joining) {
      __assert_fail("master->state == DFG_Joining",
                    "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                    ,0x9f1,"void perform_deployment(EVdfg)");
    }
    p_Var13->state = DFG_Starting;
    iVar9 = CMtrace_val[0xd];
    if (p_Var13->cm->CMTrace_file == (FILE *)0x0) {
      iVar9 = CMtrace_init(p_Var13->cm,EVdfgVerbose);
    }
    if (iVar9 != 0) {
      if (CMtrace_PID != 0) {
        pFVar23 = (FILE *)p_Var13->cm->CMTrace_file;
        _Var10 = getpid();
        pVar20 = pthread_self();
        fprintf(pFVar23,"P%lxT%lx - ",(long)_Var10,pVar20);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)local_b8);
        fprintf((FILE *)p_Var13->cm->CMTrace_file,"%lld.%.9ld - ",local_b8._0_8_,local_b8._8_8_);
      }
      fprintf((FILE *)p_Var13->cm->CMTrace_file,
              "EVDFG check all nodes registered -  master DFG state is %s\n",
              str_state[p_Var13->state]);
    }
    fflush((FILE *)p_Var13->cm->CMTrace_file);
    add_bridge_stones(dfg,dfg->working_state);
    dfg->deploy_ack_count = 0;
    if (dfg->deploy_ack_condition == -1) {
      iVar9 = INT_CMCondition_get(p_Var13->cm,(CMConnection)0x0);
      dfg->deploy_ack_condition = iVar9;
    }
    master = local_c0;
    p_Var13 = dfg->master;
    iVar9 = p_Var13->node_count;
    if (0 < iVar9) {
      lVar26 = 0x30;
      lVar30 = 0;
      do {
        deploy_to_node(dfg,(int)lVar30,dfg->working_state);
        p_Var13 = dfg->master;
        *(undefined4 *)((long)&p_Var13->nodes->name + lVar26) = 1;
        lVar30 = lVar30 + 1;
        iVar9 = p_Var13->node_count;
        lVar26 = lVar26 + 0x38;
      } while (lVar30 < iVar9);
    }
  }
  else {
    iVar9 = CMtrace_val[0xd];
    if (p_Var13->cm->CMTrace_file == (FILE *)0x0) {
      iVar9 = CMtrace_init(p_Var13->cm,EVdfgVerbose);
    }
    if (iVar9 != 0) {
      if (CMtrace_PID != 0) {
        pFVar23 = (FILE *)p_Var13->cm->CMTrace_file;
        _Var10 = getpid();
        pVar20 = pthread_self();
        fprintf(pFVar23,"P%lxT%lx - ",(long)_Var10,pVar20);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)local_b8);
        fprintf((FILE *)p_Var13->cm->CMTrace_file,"%lld.%.9ld - ",local_b8._0_8_,local_b8._8_8_);
      }
      fprintf((FILE *)p_Var13->cm->CMTrace_file,
              "EVDFG perform_deployment -  master DFG state set to %s\n",str_state[p_Var13->state]);
    }
    fflush((FILE *)p_Var13->cm->CMTrace_file);
    if (p_Var13->state != DFG_Reconfiguring) {
      __assert_fail("master->state == DFG_Reconfiguring",
                    "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                    ,0x9ff,"void perform_deployment(EVdfg)");
    }
    p_Var12 = dfg->working_state;
    if (0 < p_Var12->pending_action_count) {
      p_Var24 = dfg->master;
      p_Var11 = p_Var12->pending_action_queue;
      lVar30 = 0;
      do {
        p_Var7 = p_Var11 + lVar30;
        local_b8._0_4_ = p_Var7->type;
        local_b8._4_4_ = p_Var7->stone_id;
        local_b8._8_8_ = *(undefined8 *)&p_Var7->node_for_action;
        local_a8.node_join.node_name = p_Var11[lVar30].u.bridge.action;
        local_a8.node_join.contact_string = (char *)*(undefined8 *)((long)&p_Var11[lVar30].u + 8);
        p_Var16 = *p_Var12->stones;
        if (p_Var16->stone_id != p_Var7->stone_id) {
          lVar26 = 1;
          do {
            p_Var16 = p_Var12->stones[lVar26];
            lVar26 = lVar26 + 1;
          } while (p_Var16->stone_id != p_Var7->stone_id);
        }
        uVar4 = p_Var16->node;
        p_Var32 = p_Var24->cm;
        pFVar23 = (FILE *)p_Var32->CMTrace_file;
        if (p_Var24->nodes[(int)uVar4].shutdown_status_contribution == -3) {
          iVar9 = CMtrace_val[0xd];
          if (pFVar23 == (FILE *)0x0) {
            iVar9 = CMtrace_init(p_Var32,EVdfgVerbose);
          }
          if (iVar9 != 0) {
            printf("Skipping action because node failed -> ");
            act._8_8_ = local_b8._8_8_;
            act.type = local_b8._0_4_;
            act.stone_id = local_b8._4_4_;
            act.u.create.action =
                 (anon_struct_8_1_4c536f74_for_create)
                 (anon_struct_8_1_4c536f74_for_create)local_a8.node_join.node_name;
            act.u._8_8_ = local_a8.node_join.contact_string;
            fdump_dfg_config_action(p_Var24->cm->CMTrace_file,act);
          }
          p_Var11 = p_Var12->pending_action_queue;
          p_Var11[lVar30].type = ACT_no_op;
        }
        else {
          if (pFVar23 == (FILE *)0x0) {
            iVar9 = CMtrace_init(p_Var32,EVdfgVerbose);
            if (iVar9 != 0) {
              pFVar23 = (FILE *)p_Var24->cm->CMTrace_file;
              goto LAB_001479f1;
            }
          }
          else if (CMtrace_val[0xd] != 0) {
LAB_001479f1:
            fprintf(pFVar23,"Assigning action to node %d -> ",(ulong)uVar4);
            act_00._8_8_ = local_b8._8_8_;
            act_00.type = local_b8._0_4_;
            act_00.stone_id = local_b8._4_4_;
            act_00.u.create.action =
                 (anon_struct_8_1_4c536f74_for_create)
                 (anon_struct_8_1_4c536f74_for_create)local_a8.node_join.node_name;
            act_00.u._8_8_ = local_a8.node_join.contact_string;
            fdump_dfg_config_action(p_Var24->cm->CMTrace_file,act_00);
          }
          p_Var11 = p_Var12->pending_action_queue;
          p_Var11[lVar30].node_for_action = uVar4;
        }
        lVar30 = lVar30 + 1;
      } while (lVar30 < p_Var12->pending_action_count);
      p_Var12 = dfg->working_state;
    }
    add_bridge_stones(dfg,p_Var12);
    p_Var12 = dfg->working_state;
    iVar9 = p_Var12->stone_count;
    if (0 < iVar9) {
      lVar30 = 0;
      do {
        p_Var16 = p_Var12->stones[lVar30];
        if (p_Var16->condition == EVstone_Frozen) {
          local_b8._4_4_ = p_Var16->stone_id;
          local_b8._0_4_ = 0xb;
          local_b8._8_4_ = p_Var16->node;
          act_01._8_8_ = local_b8._8_8_;
          act_01.type = 0xb;
          act_01.stone_id = p_Var16->stone_id;
          act_01.u.create.action =
               (anon_struct_8_1_4c536f74_for_create)
               (anon_struct_8_1_4c536f74_for_create)local_a8.node_join.node_name;
          act_01.u._8_8_ = local_a8.node_join.contact_string;
          EVdfg_add_act_to_queue(p_Var12,act_01);
          p_Var16->condition = EVstone_Deployed;
          iVar9 = p_Var12->stone_count;
        }
        lVar30 = lVar30 + 1;
      } while (lVar30 < iVar9);
    }
    pFVar23 = (FILE *)p_Var13->cm->CMTrace_file;
    if (pFVar23 == (FILE *)0x0) {
      iVar9 = CMtrace_init(p_Var13->cm,EVdfgVerbose);
      if (iVar9 != 0) {
        pFVar23 = (FILE *)p_Var13->cm->CMTrace_file;
        goto LAB_00147aee;
      }
    }
    else if (CMtrace_val[0xd] != 0) {
LAB_00147aee:
      fwrite("EVDFG pending actions to be done on nodes\n",0x2a,1,pFVar23);
      p_Var12 = dfg->working_state;
      if (0 < p_Var12->pending_action_count) {
        lVar30 = 0;
        lVar26 = 0;
        do {
          puVar2 = (undefined8 *)((long)&p_Var12->pending_action_queue->u + lVar30);
          act_02.u.bridge.action = (char *)*puVar2;
          act_02._0_16_ =
               *(undefined1 (*) [16])((long)&p_Var12->pending_action_queue->type + lVar30);
          act_02.u._8_8_ = puVar2[1];
          fdump_dfg_config_action(p_Var13->cm->CMTrace_file,act_02);
          lVar26 = lVar26 + 1;
          p_Var12 = dfg->working_state;
          lVar30 = lVar30 + 0x20;
        } while (lVar26 < p_Var12->pending_action_count);
      }
    }
    p_Var24 = dfg->master;
    lVar30 = (long)p_Var24->old_node_count;
    if (p_Var24->old_node_count < p_Var24->node_count) {
      do {
        deploy_to_node(dfg,(int)lVar30,dfg->working_state);
        p_Var24 = dfg->master;
        p_Var24->nodes[lVar30].needs_ready = 1;
        p_Var12 = dfg->working_state;
        iVar9 = p_Var12->pending_action_count;
        if (0 < iVar9) {
          p_Var11 = p_Var12->pending_action_queue;
          lVar26 = 0;
          lVar31 = 0;
          do {
            p_Var1 = (__time_t *)((long)&p_Var11->type + lVar26);
            local_b8._0_8_ = *p_Var1;
            local_b8._8_8_ = p_Var1[1];
            puVar2 = (undefined8 *)((long)&p_Var11->u + lVar26);
            local_a8.node_join.node_name = (char *)*puVar2;
            local_a8.node_join.contact_string = (char *)puVar2[1];
            if (local_b8._8_4_ == (int)lVar30) {
              out = p_Var13->cm->CMTrace_file;
              if (out == (FILE *)0x0) {
                iVar9 = CMtrace_init(p_Var13->cm,EVdfgVerbose);
                if (iVar9 != 0) {
                  out = p_Var13->cm->CMTrace_file;
                  goto LAB_00147bf7;
                }
              }
              else if (CMtrace_val[0xd] != 0) {
LAB_00147bf7:
                act_03._8_8_ = local_b8._8_8_;
                act_03.type = local_b8._0_4_;
                act_03.stone_id = local_b8._4_4_;
                act_03.u.create.action =
                     (anon_struct_8_1_4c536f74_for_create)
                     (anon_struct_8_1_4c536f74_for_create)local_a8.node_join.node_name;
                act_03.u._8_8_ = local_a8.node_join.contact_string;
                fdump_dfg_config_action(out,act_03);
              }
              p_Var11 = p_Var12->pending_action_queue;
              *(undefined4 *)((long)&p_Var11->type + lVar26) = 0;
              iVar9 = p_Var12->pending_action_count;
            }
            lVar31 = lVar31 + 1;
            lVar26 = lVar26 + 0x20;
          } while (lVar31 < iVar9);
          p_Var24 = dfg->master;
        }
        lVar30 = lVar30 + 1;
      } while (lVar30 < p_Var24->node_count);
    }
    p_Var12 = dfg->working_state;
    master = local_c0;
    local_78 = p_Var24;
    if (0 < p_Var12->pending_action_count) {
      p_Var32 = p_Var24->cm;
      local_58 = (_EVdfg_config_action *)0x4;
      lVar30 = 0;
      local_48 = p_Var32;
      do {
        p_Var11 = p_Var12->pending_action_queue + lVar30;
        local_e8._0_4_ = p_Var11->type;
        local_e8._4_4_ = p_Var11->stone_id;
        uStack_e0 = *(undefined8 *)&p_Var11->node_for_action;
        paVar3 = &p_Var12->pending_action_queue[lVar30].u;
        local_d8 = paVar3->period;
        pcStack_d0 = (&paVar3->create)[1].action;
        iVar9 = CMtrace_val[0xd];
        if (p_Var32->CMTrace_file == (FILE *)0x0) {
          iVar9 = CMtrace_init(p_Var32,EVdfgVerbose);
        }
        if (iVar9 != 0) {
          act_04._8_8_ = uStack_e0;
          act_04.type = (int)local_e8;
          act_04.stone_id = (int)(local_e8 >> 0x20);
          act_04.u.period = local_d8;
          act_04.u._8_8_ = pcStack_d0;
          fdump_dfg_config_action(p_Var24->cm->CMTrace_file,act_04);
        }
        iVar9 = p_Var24->nodes[(int)uStack_e0].self;
        if (iVar9 == 0) {
          p_Var28 = p_Var24->nodes[(int)uStack_e0].conn;
        }
        else {
          p_Var28 = (CMConnection)0x0;
        }
        switch(local_e8 & 0xffffffff) {
        case 0:
        case 2:
        case 3:
        case 0xc:
          break;
        case 1:
        case 0xd:
          uVar4 = p_Var12->pending_action_queue[lVar30].node_for_action;
          lVar26 = (long)(int)uVar4;
          local_40 = INT_CMlookup_format(p_Var24->cm,EVdfg_deploy_format_list);
          iVar9 = CMtrace_val[0xd];
          if (p_Var24->cm->CMTrace_file == (FILE *)0x0) {
            iVar9 = CMtrace_init(p_Var24->cm,EVdfgVerbose);
          }
          if (iVar9 != 0) {
            if (CMtrace_PID != 0) {
              pFVar23 = (FILE *)p_Var24->cm->CMTrace_file;
              _Var10 = getpid();
              pVar20 = pthread_self();
              p_Var24 = local_78;
              fprintf(pFVar23,"P%lxT%lx - ",(long)_Var10,pVar20);
            }
            if (CMtrace_timing != 0) {
              clock_gettime(1,(timespec *)local_b8);
              fprintf((FILE *)p_Var24->cm->CMTrace_file,"%lld.%.9ld - ",local_b8._0_8_,
                      local_b8._8_8_);
            }
            fprintf((FILE *)p_Var24->cm->CMTrace_file,
                    "Master in deploy_msg_for_node for client %s, node %d\n",
                    p_Var24->nodes[lVar26].canonical_name,(ulong)uVar4);
          }
          fflush((FILE *)p_Var24->cm->CMTrace_file);
          local_70._8_8_ = (EVdfg_stone_state *)0x0;
          local_38 = lVar26 * 0x38;
          local_70._0_8_ = p_Var24->nodes[lVar26].canonical_name;
          local_70._16_8_ = INT_CMmalloc(0x40);
          uVar25 = (ulong)p_Var12->pending_action_count;
          lVar31 = lVar30;
          p_Var11 = local_58;
          lVar27 = lVar26;
          if (lVar30 < (long)uVar25) {
            do {
              local_50 = lVar27;
              p_Var7 = p_Var12->pending_action_queue;
              p_Var16 = (EVdfg_stone_state)(lVar31 * 0x20);
              EVar5 = p_Var7[lVar31].type;
              if ((10 < EVar5 - ACT_add_action) && (EVar5 != ACT_no_op)) {
                iVar9 = p_Var7[lVar31].stone_id;
                if ((EVar5 == ACT_create_bridge) || (EVar5 == ACT_create)) {
                  if (p_Var7[lVar31].node_for_action == (int)lVar26) {
                    iVar21 = p_Var12->stone_count;
                    if (0 < iVar21) {
                      lVar26 = 0;
                      do {
                        if (p_Var12->stones[lVar26]->stone_id == iVar9) {
                          add_stone_to_deploy_msg
                                    ((EVdfg_configuration)local_70,
                                     (EVdfg_deploy_msg *)p_Var12->stones[lVar26],p_Var16);
                          iVar21 = p_Var12->stone_count;
                          p_Var16 = extraout_RDX;
                        }
                        lVar26 = lVar26 + 1;
                      } while (lVar26 < iVar21);
                      uVar25 = (ulong)(uint)p_Var12->pending_action_count;
                      lVar26 = local_50;
                    }
                    if (lVar31 < (int)uVar25) {
                      piVar17 = (int *)((long)&p_Var11->type +
                                       (long)&p_Var12->pending_action_queue->type);
                      lVar27 = lVar31;
                      do {
                        if (*piVar17 == iVar9) {
                          piVar17[-1] = 0;
                        }
                        lVar27 = lVar27 + 1;
                        piVar17 = piVar17 + 8;
                      } while (lVar27 < (int)uVar25);
                    }
                  }
                }
                else {
                  printf("Bad action type in build_deploy_msg_for_nodes (action type %d)\n");
                  uVar25 = (ulong)(uint)p_Var12->pending_action_count;
                }
              }
              lVar31 = lVar31 + 1;
              p_Var11 = p_Var11 + 1;
              lVar27 = local_50;
            } while (lVar31 < (int)uVar25);
          }
          p_Var24 = local_78;
          master = local_c0;
          p_Var6 = local_78->nodes;
          if (*(int *)((long)&p_Var6->needs_ready + local_38) == 0) {
            *(undefined4 *)((long)&p_Var6->needs_ready + local_38) = 1;
            piVar17 = &local_78->dfg->deploy_ack_count;
            *piVar17 = *piVar17 + -1;
          }
          p_Var28 = *(CMConnection *)((long)&p_Var6->conn + local_38);
          if (p_Var28 == (CMConnection)0x0) {
            IntCManager_unlock(local_78->cm,
                               "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                               ,0x8d6);
            local_a8.node_join.node_name = "master";
            dfg_deploy_handler(p_Var24->cm,(CMConnection)0x0,local_70,p_Var24->client,in_R8);
            handle_deploy_ack(p_Var24,(EVmaster_msg_ptr)local_b8);
            IntCManager_lock(p_Var24->cm,
                             "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                             ,0x8da);
          }
          else {
            INT_CMwrite(p_Var28,local_40,local_70);
          }
          if (0 < (int)local_70._8_4_) {
            lVar26 = 0;
            lVar31 = 0;
            do {
              free(*(void **)(local_70._16_8_ + lVar26 + 0x20));
              pvVar8 = *(void **)(local_70._16_8_ + lVar26 + 8);
              if (pvVar8 != (void *)0x0) {
                free(pvVar8);
              }
              pvVar8 = *(void **)(local_70._16_8_ + lVar26 + 0x38);
              if (pvVar8 != (void *)0x0) {
                free(pvVar8);
              }
              lVar31 = lVar31 + 1;
              lVar26 = lVar26 + 0x40;
            } while (lVar31 < (int)local_70._8_4_);
          }
          free((void *)local_70._16_8_);
          p_Var32 = local_48;
          break;
        case 4:
          EVar22 = local_d8.usecs;
          if (iVar9 != 0) goto LAB_00147e56;
LAB_001481c5:
          INT_REVstone_set_output(p_Var28,local_e8._4_4_,local_d8.secs,EVar22);
          break;
        case 5:
          if (iVar9 == 0) {
            INT_REVstone_add_split_target(p_Var28,local_e8._4_4_,local_d8.usecs);
          }
          else {
            INT_EVstone_add_split_target(p_Var32,local_e8._4_4_,local_d8.usecs);
          }
          break;
        case 6:
          if (iVar9 == 0) {
            EVar22 = -1;
            goto LAB_001481c5;
          }
          EVar22 = -1;
LAB_00147e56:
          INT_EVstone_set_output(p_Var32,local_e8._4_4_,local_d8.secs,EVar22);
          break;
        case 7:
          if (iVar9 == 0) {
            INT_REVstone_remove_split_target(p_Var28,local_e8._4_4_,local_d8.usecs);
          }
          else {
            INT_EVstone_remove_split_target(p_Var32,local_e8._4_4_,local_d8.usecs);
          }
          break;
        case 8:
          if (iVar9 == 0) {
            INT_REVset_attr_list(p_Var28,local_e8._4_4_,(attr_list)local_d8);
          }
          else {
            INT_EVset_attr_list(p_Var32,local_e8._4_4_,(attr_list)local_d8);
          }
          break;
        case 9:
          if (iVar9 == 0) {
            INT_REVdestroy_stone(p_Var28,local_e8._4_4_);
          }
          else {
            INT_EVdestroy_stone(p_Var32,local_e8._4_4_);
          }
          break;
        case 10:
          if (iVar9 == 0) {
            INT_REVfreeze_stone(p_Var28,local_e8._4_4_);
          }
          else {
            INT_EVfreeze_stone(p_Var32,local_e8._4_4_);
          }
          break;
        case 0xb:
          if (iVar9 == 0) {
            INT_REVunfreeze_stone(p_Var28,local_e8._4_4_);
          }
          else {
            INT_EVunfreeze_stone(p_Var32,local_e8._4_4_);
          }
          break;
        default:
          printf("Bad action in perform_action_on_nodes %d\n");
        }
        lVar30 = lVar30 + 1;
        local_58 = local_58 + 1;
      } while (lVar30 < p_Var12->pending_action_count);
      p_Var12 = dfg->working_state;
    }
    free(p_Var12->pending_action_queue);
    dfg->working_state->pending_action_queue = (_EVdfg_config_action *)0x0;
    p_Var13 = dfg->master;
    iVar9 = p_Var13->node_count;
  }
  if ((dfg->deploy_ack_count != iVar9) && (dfg->deploy_ack_condition != -1)) {
    IntCManager_unlock(p_Var13->cm,
                       "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                       ,0xa1a);
    CMCondition_wait(dfg->master->cm,dfg->deploy_ack_condition);
    IntCManager_lock(dfg->master->cm,
                     "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                     ,0xa1c);
  }
LAB_001483a4:
  master->no_deployment = 0;
  if (dfg->deployed_state != (EVdfg_configuration)0x0) {
    free_dfg_state(dfg->deployed_state);
  }
  p_Var12 = dfg->working_state;
  dfg->deployed_state = p_Var12;
  p_Var14 = (EVdfg_configuration)INT_CMmalloc(0x20);
  *(undefined8 *)p_Var14 = 0;
  p_Var14->stones = (EVdfg_stone_state *)0x0;
  *(undefined8 *)&p_Var14->pending_action_count = 0;
  p_Var14->pending_action_queue = (_EVdfg_config_action *)0x0;
  iVar9 = p_Var12->stone_count;
  p_Var14->stone_count = iVar9;
  pp_Var15 = (EVdfg_stone_state *)INT_CMmalloc((long)iVar9 << 3);
  p_Var14->stones = pp_Var15;
  if (0 < p_Var12->stone_count) {
    lVar30 = 0;
    do {
      p_Var16 = (EVdfg_stone_state)INT_CMmalloc(0x68);
      p_Var14->stones[lVar30] = p_Var16;
      p_Var16 = p_Var12->stones[lVar30];
      p_Var29 = p_Var14->stones[lVar30];
      for (lVar26 = 0xd; lVar26 != 0; lVar26 = lVar26 + -1) {
        iVar9 = p_Var16->bridge_stone;
        p_Var29->node = p_Var16->node;
        p_Var29->bridge_stone = iVar9;
        p_Var16 = (EVdfg_stone_state)((long)p_Var16 + (ulong)bVar33 * -0x10 + 8);
        p_Var29 = (EVdfg_stone_state)((long)p_Var29 + (ulong)bVar33 * -0x10 + 8);
      }
      pp_Var15 = p_Var12->stones;
      p_Var16 = pp_Var15[lVar30];
      if (p_Var16->out_links != (int *)0x0) {
        piVar17 = (int *)INT_CMmalloc((long)p_Var16->out_count << 2);
        pp_Var15 = p_Var14->stones;
        pp_Var15[lVar30]->out_links = piVar17;
        p_Var16 = pp_Var15[lVar30];
        memcpy(p_Var16->out_links,p_Var12->stones[lVar30]->out_links,(long)p_Var16->out_count << 2);
        pp_Var15 = p_Var12->stones;
        p_Var16 = pp_Var15[lVar30];
      }
      if (p_Var16->in_links != (int *)0x0) {
        piVar17 = (int *)INT_CMmalloc((long)p_Var16->in_count << 2);
        pp_Var15 = p_Var14->stones;
        pp_Var15[lVar30]->in_links = piVar17;
        p_Var16 = pp_Var15[lVar30];
        memcpy(p_Var16->in_links,p_Var12->stones[lVar30]->in_links,(long)p_Var16->in_count << 2);
        pp_Var15 = p_Var12->stones;
        p_Var16 = pp_Var15[lVar30];
      }
      if (p_Var16->action != (char *)0x0) {
        pcVar18 = strdup(p_Var16->action);
        p_Var14->stones[lVar30]->action = pcVar18;
        p_Var16 = pp_Var15[lVar30];
      }
      if (p_Var16->extra_actions != (char **)0x0) {
        ppcVar19 = (char **)INT_CMmalloc((long)p_Var16->action_count << 3);
        p_Var14->stones[lVar30]->extra_actions = ppcVar19;
        pp_Var15 = p_Var12->stones;
        p_Var16 = pp_Var15[lVar30];
        if (1 < p_Var16->action_count) {
          lVar26 = 0;
          do {
            if (p_Var16->extra_actions[lVar26] != (char *)0x0) {
              pcVar18 = strdup(p_Var16->extra_actions[lVar26]);
              p_Var14->stones[lVar30]->extra_actions[lVar26] = pcVar18;
              pp_Var15 = p_Var12->stones;
            }
            lVar26 = lVar26 + 1;
            p_Var16 = pp_Var15[lVar30];
          } while (lVar26 < (long)p_Var16->action_count + -1);
        }
      }
      if (p_Var16->attrs != (attr_list)0x0) {
        add_ref_attr_list();
      }
      lVar30 = lVar30 + 1;
    } while (lVar30 < p_Var12->stone_count);
  }
  dfg->working_state = p_Var14;
  format = INT_CMlookup_format(dfg->master->cm,EVdfg_ready_format_list);
  p_Var32 = dfg->master->cm;
  iVar9 = CMtrace_val[0xd];
  if (p_Var32->CMTrace_file == (FILE *)0x0) {
    iVar9 = CMtrace_init(p_Var32,EVdfgVerbose);
  }
  if (iVar9 != 0) {
    if (CMtrace_PID != 0) {
      pFVar23 = (FILE *)dfg->master->cm->CMTrace_file;
      _Var10 = getpid();
      pVar20 = pthread_self();
      fprintf(pFVar23,"P%lxT%lx - ",(long)_Var10,pVar20);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,(timespec *)local_b8);
      fprintf((FILE *)dfg->master->cm->CMTrace_file,"%lld.%.9ld - ",local_b8._0_8_,local_b8._8_8_);
    }
    fprintf((FILE *)dfg->master->cm->CMTrace_file,"Master signaling DFG %p ready for operation\n",
            dfg);
  }
  fflush((FILE *)dfg->master->cm->CMTrace_file);
  p_Var13 = dfg->master;
  if (0 < p_Var13->node_count) {
    lVar30 = 0;
    uVar25 = 0;
    do {
      p_Var6 = p_Var13->nodes;
      if (*(int *)((long)&p_Var6->needs_ready + lVar30) == 0) {
        iVar9 = CMtrace_val[0xd];
        if (p_Var13->cm->CMTrace_file == (FILE *)0x0) {
          iVar9 = CMtrace_init(p_Var13->cm,EVdfgVerbose);
        }
        if (iVar9 != 0) {
          if (CMtrace_PID != 0) {
            pFVar23 = (FILE *)dfg->master->cm->CMTrace_file;
            _Var10 = getpid();
            pVar20 = pthread_self();
            fprintf(pFVar23,"P%lxT%lx - ",(long)_Var10,pVar20);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,(timespec *)local_b8);
            fprintf((FILE *)dfg->master->cm->CMTrace_file,"%lld.%.9ld - ",local_b8._0_8_,
                    local_b8._8_8_);
          }
          fprintf((FILE *)dfg->master->cm->CMTrace_file,
                  "Master - ready not required for node %d \"%s\"\n",uVar25 & 0xffffffff,
                  *(undefined8 *)((long)&dfg->master->nodes->name + lVar30));
        }
        fflush((FILE *)dfg->master->cm->CMTrace_file);
        p_Var13 = dfg->master;
      }
      else {
        p_Var28 = *(CMConnection *)((long)&p_Var6->conn + lVar30);
        if (p_Var28 == (CMConnection)0x0) {
          if (*(int *)((long)&p_Var6->self + lVar30) == 0) {
            printf("Failure, no connection, not self, node %d\n",uVar25 & 0xffffffff);
            exit(1);
          }
          pcVar18 = 
          "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
          ;
          IntCManager_unlock(p_Var13->cm,
                             "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                             ,0xa39);
          local_e8 = CONCAT44(local_e8._4_4_,(int)uVar25);
          p_Var32 = dfg->master->cm;
          iVar9 = CMtrace_val[0xd];
          if (p_Var32->CMTrace_file == (FILE *)0x0) {
            pcVar18 = (char *)0xd;
            iVar9 = CMtrace_init(p_Var32,EVdfgVerbose);
          }
          if (iVar9 != 0) {
            if (CMtrace_PID != 0) {
              pFVar23 = (FILE *)dfg->master->cm->CMTrace_file;
              _Var10 = getpid();
              pVar20 = pthread_self();
              fprintf(pFVar23,"P%lxT%lx - ",(long)_Var10,pVar20);
            }
            if (CMtrace_timing != 0) {
              clock_gettime(1,(timespec *)local_b8);
              fprintf((FILE *)dfg->master->cm->CMTrace_file,"%lld.%.9ld - ",local_b8._0_8_,
                      local_b8._8_8_);
            }
            pcVar18 = "Master DFG %p is ready, local signalling %d\n";
            fprintf((FILE *)dfg->master->cm->CMTrace_file,
                    "Master DFG %p is ready, local signalling %d\n",dfg,
                    (ulong)(uint)dfg->client->ready_condition);
          }
          fflush((FILE *)dfg->master->cm->CMTrace_file);
          dfg_ready_handler(dfg->master->cm,(CMConnection)pcVar18,&local_e8,dfg->client,in_R8);
          IntCManager_lock(dfg->master->cm,
                           "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                           ,0xa3d);
        }
        else {
          local_e8 = CONCAT44(local_e8._4_4_,(int)uVar25);
          INT_CMwrite(p_Var28,format,&local_e8);
          p_Var32 = dfg->master->cm;
          iVar9 = CMtrace_val[0xd];
          if (p_Var32->CMTrace_file == (FILE *)0x0) {
            iVar9 = CMtrace_init(p_Var32,EVdfgVerbose);
          }
          if (iVar9 != 0) {
            if (CMtrace_PID != 0) {
              pFVar23 = (FILE *)dfg->master->cm->CMTrace_file;
              _Var10 = getpid();
              pVar20 = pthread_self();
              fprintf(pFVar23,"P%lxT%lx - ",(long)_Var10,pVar20);
            }
            if (CMtrace_timing != 0) {
              clock_gettime(1,(timespec *)local_b8);
              fprintf((FILE *)dfg->master->cm->CMTrace_file,"%lld.%.9ld - ",local_b8._0_8_,
                      local_b8._8_8_);
            }
            fprintf((FILE *)dfg->master->cm->CMTrace_file,"Master - ready sent to node %d \"%s\"\n",
                    uVar25 & 0xffffffff,*(undefined8 *)((long)&dfg->master->nodes->name + lVar30));
          }
          fflush((FILE *)dfg->master->cm->CMTrace_file);
        }
        p_Var13 = dfg->master;
        *(undefined4 *)((long)&p_Var13->nodes->needs_ready + lVar30) = 0;
      }
      uVar25 = uVar25 + 1;
      lVar30 = lVar30 + 0x38;
    } while ((long)uVar25 < (long)p_Var13->node_count);
  }
  dfg->deployed_stone_count = dfg->stone_count;
  local_c0->old_node_count = local_c0->node_count;
  return;
}

Assistant:

static void
check_all_nodes_registered(EVmaster master)
{
    int i;
    EVdfg dfg = master->dfg;
    if (master->node_join_handler != NULL) {
	EVint_node_list node = &master->nodes[master->node_count-1];
	CManager_unlock(master->cm);
	(master->node_join_handler)(master, node->name, NULL, NULL);
	CManager_lock(master->cm);
	dfg = master->dfg;
	if ((dfg == NULL) || (dfg->realized == 0) || 
	    (dfg->realized == 1 && master->reconfig == 1)) return;
    } else {
	/* must be static node list */
	for(i=0; i<master->node_count; i++) {
	    if (!master->nodes[i].self && (master->nodes[i].conn == NULL)) {
		return;
	    }
	}
    }
	
    if (master->no_deployment == 0) {
	perform_deployment(dfg);
	wait_for_deploy_acks(dfg);
    }
    master->no_deployment = 0;
    if (dfg->deployed_state) {
	free_dfg_state(dfg->deployed_state);
    }
    dfg->deployed_state = dfg->working_state;
    dfg->working_state = copy_dfg_state(dfg->deployed_state);
    
    signal_ready(dfg);
    dfg->deployed_stone_count = dfg->stone_count;
    master->old_node_count = master->node_count;
}